

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::LessThanTest<short,unsigned_int>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar2;
  uint in_stack_ffffffffffffffe0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  undefined2 in_stack_ffffffffffffffe4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe6;
  
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_ffffffffffffffe6.m_int,
                           CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
               (int *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar1 = ::operator<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe6);
  uVar2 = false;
  if (bVar1) {
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_ffffffffffffffe6.m_int,
                             CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
                 (int *)(ulong)in_stack_ffffffffffffffd8);
    bVar1 = ::operator<(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0);
    uVar2 = false;
    if (bVar1) {
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(in_stack_ffffffffffffffe6.m_int,
                               CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
                   (int *)(ulong)in_stack_ffffffffffffffd8);
      rhs.m_int = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_ffffffffffffffe6.m_int,
                                 CONCAT24(in_stack_ffffffffffffffe4,7)),
                     (int *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
      uVar2 = ::operator<(in_stack_ffffffffffffffe6,rhs);
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}